

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

void __thiscall RangeIterator::SeekBeyond(RangeIterator *this,RangeIterator_conflict *target)

{
  undefined1 *puVar1;
  ulong uVar2;
  vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_> *pvVar3;
  RangeNode *pRVar4;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar5;
  int iVar6;
  const_iterator cVar7;
  S2CellId local_18;
  
  uVar2 = (target->range_max_).id_;
  local_18.id_ = uVar2 + (-uVar2 & uVar2) * 2;
  cVar7 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::lower_bound<S2CellId>
                    ((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                      *)&this[1].it_._M_current[2].contents,&local_18);
  pbVar5 = cVar7.node;
  this[2].range_nodes_ =
       (vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_> *)pbVar5;
  iVar6 = cVar7.position;
  *(int *)&this[2].it_._M_current = iVar6;
  if ((pbVar5 == (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  *)this[3].range_nodes_) && (iVar6 == *(int *)&this[3].it_._M_current)) {
    (this->it_)._M_current = (RangeNode *)0xffffffffffffffff;
    this[1].range_nodes_ =
         (vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_> *)0x0;
  }
  else {
    if (((undefined1  [16])cVar7 & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                    ,0x1e1,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    pvVar3 = *(vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_> **)
              (pbVar5 + (long)iVar6 * 0x10 + 0x18);
    (this->it_)._M_current = *(RangeNode **)(pbVar5 + (long)iVar6 * 0x10 + 0x10);
    this[1].range_nodes_ = pvVar3;
  }
  pRVar4 = (this->it_)._M_current;
  if ((pRVar4 != (RangeNode *)0xffffffffffffffff) &&
     ((long)pRVar4 - (~(ulong)pRVar4 & (ulong)((long)&pRVar4[-1].contents + 3U)) <=
      (target->range_max_).id_)) {
    MutableS2ShapeIndex::Iterator::Next((Iterator *)this);
  }
  pRVar4 = (this->it_)._M_current;
  puVar1 = (undefined1 *)((long)&pRVar4[-1].contents + 3);
  this[4].range_nodes_ =
       (vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_> *)
       ((long)pRVar4 - (~(ulong)pRVar4 & (ulong)puVar1));
  this[4].it_._M_current = (RangeNode *)((ulong)puVar1 | (ulong)pRVar4);
  return;
}

Assistant:

void SeekBeyond(const RangeIterator& target) {
    it_.Seek(target.range_max().next());
    if (!it_.done() && it_.id().range_min() <= target.range_max()) {
      it_.Next();
    }
    Refresh();
  }